

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

bool_t zzIsSumWEq_fast(word *b,word *a,size_t n,word w)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (n == sVar1) {
      return (bool_t)(w == 0);
    }
    if (b[sVar1] != w + a[sVar1]) break;
    w = (word)(b[sVar1] < a[sVar1]);
    sVar1 = sVar1 + 1;
  }
  return 0;
}

Assistant:

bool_t FAST(zzIsSumWEq)(const word b[], const word a[], size_t n, 
	register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	for (i = 0; i < n; ++i)
	{
		if (b[i] != (word)(a[i] + w))
		{
			w = 0;
			return FALSE;
		}
		w = b[i] < a[i];
	}
	return w == 0;
}